

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

int __thiscall cmake::AddCMakePaths(cmake *this)

{
  bool bVar1;
  string *psVar2;
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"CMAKE_COMMAND",&local_39);
  psVar2 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
  AddCacheEntry(this,&local_38,(psVar2->_M_dataplus)._M_p,"Path to CMake executable.",4);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"CMAKE_CTEST_COMMAND",&local_39);
  psVar2 = cmSystemTools::GetCTestCommand_abi_cxx11_();
  AddCacheEntry(this,&local_38,(psVar2->_M_dataplus)._M_p,"Path to ctest program executable.",4);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"CMAKE_CPACK_COMMAND",&local_39);
  psVar2 = cmSystemTools::GetCPackCommand_abi_cxx11_();
  AddCacheEntry(this,&local_38,(psVar2->_M_dataplus)._M_p,"Path to cpack program executable.",4);
  std::__cxx11::string::~string((string *)&local_38);
  psVar2 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
  std::operator+(&local_38,psVar2,"/Modules/CMake.cmake");
  bVar1 = cmsys::SystemTools::FileExists(local_38._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_38);
  if (!bVar1) {
    psVar2 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
    cmSystemTools::Error
              ("Could not find CMAKE_ROOT !!!\nCMake has most likely not been installed correctly.\nModules directory not found in\n"
               ,(psVar2->_M_dataplus)._M_p,(char *)0x0,(char *)0x0);
  }
  else {
    std::__cxx11::string::string((string *)&local_38,"CMAKE_ROOT",&local_39);
    psVar2 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
    AddCacheEntry(this,&local_38,(psVar2->_M_dataplus)._M_p,"Path to CMake installation.",4);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return (uint)bVar1;
}

Assistant:

int cmake::AddCMakePaths()
{
  // Save the value in the cache
  this->AddCacheEntry("CMAKE_COMMAND",
                      cmSystemTools::GetCMakeCommand().c_str(),
                      "Path to CMake executable.", cmStateEnums::INTERNAL);
#ifdef CMAKE_BUILD_WITH_CMAKE
  this->AddCacheEntry(
    "CMAKE_CTEST_COMMAND", cmSystemTools::GetCTestCommand().c_str(),
    "Path to ctest program executable.", cmStateEnums::INTERNAL);
  this->AddCacheEntry(
    "CMAKE_CPACK_COMMAND", cmSystemTools::GetCPackCommand().c_str(),
    "Path to cpack program executable.", cmStateEnums::INTERNAL);
#endif
  if (!cmSystemTools::FileExists(
        (cmSystemTools::GetCMakeRoot() + "/Modules/CMake.cmake").c_str())) {
    // couldn't find modules
    cmSystemTools::Error(
      "Could not find CMAKE_ROOT !!!\n"
      "CMake has most likely not been installed correctly.\n"
      "Modules directory not found in\n",
      cmSystemTools::GetCMakeRoot().c_str());
    return 0;
  }
  this->AddCacheEntry("CMAKE_ROOT", cmSystemTools::GetCMakeRoot().c_str(),
                      "Path to CMake installation.", cmStateEnums::INTERNAL);

  return 1;
}